

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O3

int __thiscall arbiter::http::Curl::init(Curl *this,EVP_PKEY_CTX *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long *plVar2;
  long lVar3;
  curl_slist *pcVar4;
  _Rb_tree_node_base *p_Var5;
  long *extraout_RAX;
  Query *in_RCX;
  long *plVar6;
  size_type *psVar7;
  long in_RDX;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  curl_slist_free_all(this->m_headers);
  this->m_headers = (curl_slist *)0x0;
  buildQueryString(&local_90,in_RCX);
  plVar2 = (long *)::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,*(ulong *)ctx);
  local_70 = &local_60;
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar2[3];
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  curl_easy_setopt(this->m_curl,0x2712,local_70);
  lVar3 = curl_version_info(9);
  if ((*(byte *)(lVar3 + 0x20) & 0x80) == 0) {
    curl_easy_setopt(this->m_curl,99,1);
  }
  curl_easy_setopt(this->m_curl,0x71,1);
  curl_easy_setopt(this->m_curl,0x2776,"");
  curl_easy_setopt(this->m_curl,0x13,1);
  curl_easy_setopt(this->m_curl,0x14,this->m_timeout);
  curl_easy_setopt(this->m_curl,0x9c,1000);
  curl_easy_setopt(this->m_curl,0xd4,1000);
  curl_easy_setopt(this->m_curl,0x29,this->m_verbose);
  curl_easy_setopt(this->m_curl,0x34,this->m_followRedirect);
  curl_easy_setopt(this->m_curl,0x40,this->m_verifyPeer);
  pbVar1 = (this->m_caPath)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    curl_easy_setopt(this->m_curl,0x2771,(pbVar1->_M_dataplus)._M_p);
  }
  pbVar1 = (this->m_caInfo)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    curl_easy_setopt(this->m_curl,0x2751,(pbVar1->_M_dataplus)._M_p);
  }
  pbVar1 = (this->m_proxy)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    curl_easy_setopt(this->m_curl,0x2714,(pbVar1->_M_dataplus)._M_p);
  }
  p_Var5 = *(_Rb_tree_node_base **)(in_RDX + 0x18);
  if (p_Var5 != (_Rb_tree_node_base *)(in_RDX + 8)) {
    do {
      pcVar4 = this->m_headers;
      local_50[0] = local_40;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      ::std::__cxx11::string::append((char *)local_50);
      plVar2 = (long *)::std::__cxx11::string::_M_append((char *)local_50,*(ulong *)(p_Var5 + 2));
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      psVar7 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_90.field_2._M_allocated_capacity = *psVar7;
        local_90.field_2._8_4_ = (undefined4)plVar2[3];
        local_90.field_2._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar7;
        local_90._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_90._M_string_length = plVar2[1];
      *plVar2 = (long)psVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      pcVar4 = (curl_slist *)curl_slist_append(pcVar4,local_90._M_dataplus._M_p);
      this->m_headers = pcVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != (_Rb_tree_node_base *)(in_RDX + 8));
  }
  plVar2 = &local_60;
  if (local_70 != plVar2) {
    operator_delete(local_70);
    plVar2 = extraout_RAX;
  }
  return (int)plVar2;
}

Assistant:

void Curl::init(
        const std::string rawPath,
        const Headers& headers,
        const Query& query)
{
#ifdef ARBITER_CURL
    // Reset our curl instance and header list.
    curl_slist_free_all(m_headers);
    m_headers = nullptr;

    // Set path.
    const std::string path(rawPath + buildQueryString(query));
    curl_easy_setopt(m_curl, CURLOPT_URL, path.c_str());

    curl_version_info_data* versioninfo = curl_version_info(CURLVERSION_NOW);
    if (!(versioninfo->features & CURL_VERSION_ASYNCHDNS))
    {
        curl_easy_setopt(m_curl, CURLOPT_NOSIGNAL, 1L);
    }

    // Substantially faster DNS lookups without IPv6.
    curl_easy_setopt(m_curl, CURLOPT_IPRESOLVE, CURL_IPRESOLVE_V4);

    // See https://curl.se/libcurl/c/CURLOPT_ACCEPT_ENCODING.html
    //
    // To aid applications not having to bother about what specific algorithms
    // this particular libcurl build supports, libcurl allows a zero-length
    // string to be set ("") to ask for an Accept-Encoding: header to be used
    // that contains all built-in supported encodings.
    curl_easy_setopt(m_curl, CURLOPT_ACCEPT_ENCODING, "");

    // Don't wait forever.  Use the low-speed options instead of the timeout
    // option to make the timeout a sliding window instead of an absolute.
    curl_easy_setopt(m_curl, CURLOPT_LOW_SPEED_LIMIT, 1L);
    curl_easy_setopt(m_curl, CURLOPT_LOW_SPEED_TIME, m_timeout);

    curl_easy_setopt(m_curl, CURLOPT_CONNECTTIMEOUT_MS, 1000L);
    curl_easy_setopt(m_curl, CURLOPT_ACCEPTTIMEOUT_MS, 1000L);

    auto toLong([](bool b) { return b ? 1L : 0L; });

    // Configuration options.
    curl_easy_setopt(m_curl, CURLOPT_VERBOSE, toLong(m_verbose));
    curl_easy_setopt(m_curl, CURLOPT_FOLLOWLOCATION, toLong(m_followRedirect));
    curl_easy_setopt(m_curl, CURLOPT_SSL_VERIFYPEER, toLong(m_verifyPeer));
    if (m_caPath) curl_easy_setopt(m_curl, CURLOPT_CAPATH, m_caPath->c_str());
    if (m_caInfo) curl_easy_setopt(m_curl, CURLOPT_CAINFO, m_caInfo->c_str());
    if (m_proxy) curl_easy_setopt(m_curl, CURLOPT_PROXY, m_proxy->c_str());

    // Insert supplied headers.
    for (const auto& h : headers)
    {
        m_headers = curl_slist_append(
                m_headers,
                (h.first + ": " + h.second).c_str());
    }
#else
    throw ArbiterError(fail);
#endif
}